

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

shared_ptr<const_JointPolicyPureVectorForClusteredBG>
boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG_const,JointPolicyDiscretePure_const>
          (shared_ptr<const_JointPolicyDiscretePure> *r)

{
  shared_ptr<const_JointPolicyPureVectorForClusteredBG> *this;
  shared_ptr<const_JointPolicyDiscretePure> *r_00;
  sp_counted_base *extraout_RDX;
  sp_counted_base *extraout_RDX_00;
  shared_count sVar1;
  shared_ptr<const_JointPolicyDiscretePure> *in_RSI;
  element_type *in_RDI;
  shared_ptr<const_JointPolicyPureVectorForClusteredBG> sVar2;
  E *p;
  
  this = (shared_ptr<const_JointPolicyPureVectorForClusteredBG> *)
         shared_ptr<const_JointPolicyDiscretePure>::get(in_RSI);
  if (this == (shared_ptr<const_JointPolicyPureVectorForClusteredBG> *)0x0) {
    r_00 = (shared_ptr<const_JointPolicyDiscretePure> *)0x0;
  }
  else {
    r_00 = (shared_ptr<const_JointPolicyDiscretePure> *)
           __dynamic_cast(this,&JointPolicyDiscretePure::typeinfo,
                          &JointPolicyPureVectorForClusteredBG::typeinfo,0);
  }
  if (r_00 == (shared_ptr<const_JointPolicyDiscretePure> *)0x0) {
    shared_ptr<const_JointPolicyPureVectorForClusteredBG>::shared_ptr
              ((shared_ptr<const_JointPolicyPureVectorForClusteredBG> *)0x12b4bf);
    sVar1.pi_ = extraout_RDX_00;
  }
  else {
    shared_ptr<JointPolicyPureVectorForClusteredBG_const>::shared_ptr<JointPolicyDiscretePure_const>
              (this,r_00,(element_type *)0x12b4b3);
    sVar1.pi_ = extraout_RDX;
  }
  sVar2.pn.pi_ = sVar1.pi_;
  sVar2.px = in_RDI;
  return sVar2;
}

Assistant:

shared_ptr<T> dynamic_pointer_cast( shared_ptr<U> const & r ) BOOST_NOEXCEPT
{
    (void) dynamic_cast< T* >( static_cast< U* >( 0 ) );

    typedef typename shared_ptr<T>::element_type E;

    E * p = dynamic_cast< E* >( r.get() );
    return p? shared_ptr<T>( r, p ): shared_ptr<T>();
}